

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utFindInvalidData.cpp
# Opt level: O3

void __thiscall
utFindInvalidDataProcess_testStepNegativeResult_Test::TestBody
          (utFindInvalidDataProcess_testStepNegativeResult_Test *this)

{
  aiMesh *paVar1;
  aiVector3D *paVar2;
  long lVar3;
  bool bVar4;
  char *pcVar5;
  char *in_R9;
  bool bVar6;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_78;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  string local_60;
  utFindInvalidDataProcess_testStepNegativeResult_Test *local_40;
  AssertHelper local_38;
  
  paVar1 = (this->super_utFindInvalidDataProcess).mMesh;
  memset(paVar1->mNormals,0,(ulong)paVar1->mNumVertices * 0xc);
  paVar1 = (this->super_utFindInvalidDataProcess).mMesh;
  memset(paVar1->mBitangents,0,(ulong)paVar1->mNumVertices * 0xc);
  paVar2 = ((this->super_utFindInvalidDataProcess).mMesh)->mTextureCoords[2];
  paVar2[0x1c7].x = NAN;
  paVar2[0x1c7].y = NAN;
  paVar2[0x1c7].z = NAN;
  Assimp::FindInvalidDataProcess::ProcessMesh
            ((this->super_utFindInvalidDataProcess).mProcess,
             (this->super_utFindInvalidDataProcess).mMesh);
  bVar6 = ((this->super_utFindInvalidDataProcess).mMesh)->mVertices == (aiVector3D *)0x0;
  local_70.ptr_._0_1_ = !bVar6;
  local_68.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_40 = this;
  if (bVar6) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(internal *)&local_70,(AssertionResult *)"NULL != mMesh->mVertices","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFindInvalidData.cpp"
               ,0x76,(char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                      (char)local_60._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) !=
        &local_60.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p));
    }
    if (local_78.data_ != (AssertHelperData *)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (local_78.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_78.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((local_40->super_utFindInvalidDataProcess).mMesh)->mNormals;
  local_78.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperEQ<aiVector3t<float>*,aiVector3t<float>*>
            ((internal *)&local_60,"__null","mMesh->mNormals",(aiVector3t<float> **)&local_78,
             (aiVector3t<float> **)&local_70);
  if ((char)local_60._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_70);
    if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_60._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFindInvalidData.cpp"
               ,0x77,pcVar5);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((aiVector3D *)local_70.ptr_ != (aiVector3D *)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && ((aiVector3D *)local_70.ptr_ != (aiVector3D *)0x0)) {
        (**(code **)(*(long *)local_70.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_60._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((local_40->super_utFindInvalidDataProcess).mMesh)->mTangents;
  local_78.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperEQ<aiVector3t<float>*,aiVector3t<float>*>
            ((internal *)&local_60,"__null","mMesh->mTangents",(aiVector3t<float> **)&local_78,
             (aiVector3t<float> **)&local_70);
  if ((char)local_60._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_70);
    if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_60._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFindInvalidData.cpp"
               ,0x78,pcVar5);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((aiVector3D *)local_70.ptr_ != (aiVector3D *)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && ((aiVector3D *)local_70.ptr_ != (aiVector3D *)0x0)) {
        (**(code **)(*(long *)local_70.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_60._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((local_40->super_utFindInvalidDataProcess).mMesh)->mBitangents;
  local_78.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperEQ<aiVector3t<float>*,aiVector3t<float>*>
            ((internal *)&local_60,"__null","mMesh->mBitangents",(aiVector3t<float> **)&local_78,
             (aiVector3t<float> **)&local_70);
  if ((char)local_60._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_70);
    if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_60._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFindInvalidData.cpp"
               ,0x79,pcVar5);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((aiVector3D *)local_70.ptr_ != (aiVector3D *)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && ((aiVector3D *)local_70.ptr_ != (aiVector3D *)0x0)) {
        (**(code **)(*(long *)local_70.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_60._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  lVar3 = 0;
  bVar6 = true;
  do {
    bVar4 = bVar6;
    bVar6 = ((local_40->super_utFindInvalidDataProcess).mMesh)->mTextureCoords[lVar3] ==
            (aiVector3D *)0x0;
    local_70.ptr_._0_1_ = !bVar6;
    local_68.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar6) {
      testing::Message::Message((Message *)&local_78);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_60,(internal *)&local_70,
                 (AssertionResult *)"NULL != mMesh->mTextureCoords[i]","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFindInvalidData.cpp"
                 ,0x7c,(char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                        (char)local_60._M_dataplus._M_p));
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) !=
          &local_60.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p));
      }
      if (local_78.data_ != (AssertHelperData *)0x0) {
        bVar6 = testing::internal::IsTrue(true);
        if ((bVar6) && (local_78.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_78.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar3 = 1;
    bVar6 = false;
  } while (bVar4);
  lVar3 = 0;
  do {
    local_70.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((local_40->super_utFindInvalidDataProcess).mMesh)->mTextureCoords[lVar3 + 2];
    local_78.data_ = (AssertHelperData *)0x0;
    testing::internal::CmpHelperEQ<aiVector3t<float>*,aiVector3t<float>*>
              ((internal *)&local_60,"__null","mMesh->mTextureCoords[i]",
               (aiVector3t<float> **)&local_78,(aiVector3t<float> **)&local_70);
    if ((char)local_60._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_70);
      pcVar5 = "";
      if ((undefined8 *)local_60._M_string_length != (undefined8 *)0x0) {
        pcVar5 = *(char **)local_60._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFindInvalidData.cpp"
                 ,0x80,pcVar5);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((aiVector3D *)local_70.ptr_ != (aiVector3D *)0x0) {
        bVar6 = testing::internal::IsTrue(true);
        if ((bVar6) && ((aiVector3D *)local_70.ptr_ != (aiVector3D *)0x0)) {
          (**(code **)(*(long *)local_70.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_60._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  return;
}

Assistant:

TEST_F(utFindInvalidDataProcess, testStepNegativeResult) {
    ::memset(mMesh->mNormals, 0, mMesh->mNumVertices*sizeof(aiVector3D) );
    ::memset(mMesh->mBitangents, 0, mMesh->mNumVertices*sizeof(aiVector3D) );

    mMesh->mTextureCoords[2][455] = aiVector3D( std::numeric_limits<float>::quiet_NaN() );

    mProcess->ProcessMesh(mMesh);

    EXPECT_TRUE(NULL != mMesh->mVertices);
    EXPECT_EQ(NULL, mMesh->mNormals);
    EXPECT_EQ(NULL, mMesh->mTangents);
    EXPECT_EQ(NULL, mMesh->mBitangents);

    for (unsigned int i = 0; i < 2; ++i) {
        EXPECT_TRUE(NULL != mMesh->mTextureCoords[i]);
    }

    for (unsigned int i = 2; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
        EXPECT_EQ(NULL, mMesh->mTextureCoords[i]);
    }
}